

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckNotNullUsage(Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_c9;
  string local_c8;
  string local_a8;
  char *local_88;
  char *message;
  PatternType pattern_type;
  allocator local_69;
  string local_68 [8];
  string title;
  regex pattern;
  bool create_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar2 = IsCreateStatement(sql_statement);
  if (bVar2) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "(not null)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"NOT NULL Usage",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    message._0_4_ = 3;
    local_88 = anon_var_dwarf_903d6;
    std::__cxx11::string::string((string *)&local_a8,local_68);
    pcVar1 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_NONE,PATTERN_TYPE_QUERY,&local_a8,&local_c8,true,0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckNotNullUsage(Configuration& state,
                       const std::string& sql_statement,
                       bool& print_statement) {

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(not null)");
  std::string title = "NOT NULL Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use NOT NULL only if the column cannot have a missing value:  "
      "When you declare a column as NOT NULL, it should be because it would make no sense "
      "for the row to exist without a value in that column. "
      "Use null to signify a missing value for any data type.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_NONE,
               pattern_type,
               title,
               message,
               true);

}